

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

Symbol __thiscall
google::protobuf::DescriptorPool::NewPlaceholderWithMutexHeld
          (DescriptorPool *this,string *name,PlaceholderType placeholder_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  Tables *pTVar3;
  pointer pcVar4;
  bool bVar5;
  string *psVar6;
  long lVar7;
  FileDescriptor *pFVar8;
  anon_union_8_8_13f84498_for_Symbol_2 __s;
  EnumOptions *pEVar9;
  undefined8 *puVar10;
  MessageOptions *pMVar11;
  EnumValueOptions *pEVar12;
  size_type sVar13;
  bool bVar14;
  undefined8 uVar15;
  Symbol SVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_68;
  string *local_48;
  string *local_40;
  PlaceholderType local_34;
  
  if (this->mutex_ != (Mutex *)0x0) {
    internal::Mutex::AssertHeld(this->mutex_);
  }
  if (name->_M_string_length != 0) {
    sVar13 = 0;
    bVar14 = false;
    do {
      bVar2 = (name->_M_dataplus)._M_p[sVar13];
      if ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a) {
        bVar5 = false;
      }
      else {
        bVar5 = false;
        if ((bVar2 != 0x5f && 9 < (byte)(bVar2 - 0x30)) &&
           ((bVar2 != 0x2e || (bVar5 = true, bVar14)))) goto LAB_0058882b;
      }
      sVar13 = sVar13 + 1;
      bVar14 = bVar5;
    } while (name->_M_string_length != sVar13);
    if (!bVar5) {
      pTVar3 = (this->tables_).ptr_;
      if (*(name->_M_dataplus)._M_p == '.') {
        if (pTVar3 == (Tables *)0x0) goto LAB_00588c64;
        std::__cxx11::string::substr((ulong)&local_68,(ulong)name);
        psVar6 = Tables::AllocateString(pTVar3,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,
                          CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                   local_68.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        if (pTVar3 == (Tables *)0x0) goto LAB_00588c64;
        psVar6 = Tables::AllocateString(pTVar3,name);
      }
      lVar7 = std::__cxx11::string::rfind((char)psVar6,0x2e);
      if (lVar7 == -1) {
        local_40 = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
        local_48 = psVar6;
        if (internal::empty_string_once_init_ != 2) {
          local_68._M_dataplus._M_p = (pointer)&PTR__FunctionClosure0_0072ead0;
          local_68._M_string_length = (size_type)internal::InitEmptyString;
          local_68.field_2._M_local_buf[0] = '\0';
          GoogleOnceInitImpl(&internal::empty_string_once_init_,(Closure *)&local_68);
          internal::FunctionClosure0::~FunctionClosure0((FunctionClosure0 *)&local_68);
        }
      }
      else {
        pTVar3 = (this->tables_).ptr_;
        local_34 = placeholder_type;
        if (pTVar3 == (Tables *)0x0) goto LAB_00588c64;
        std::__cxx11::string::substr((ulong)&local_68,(ulong)psVar6);
        local_40 = Tables::AllocateString(pTVar3,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,
                          CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                   local_68.field_2._M_local_buf[0]) + 1);
        }
        pTVar3 = (this->tables_).ptr_;
        if (pTVar3 == (Tables *)0x0) goto LAB_00588c64;
        std::__cxx11::string::substr((ulong)&local_68,(ulong)psVar6);
        local_48 = Tables::AllocateString(pTVar3,&local_68);
        placeholder_type = local_34;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,
                          CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                   local_68.field_2._M_local_buf[0]) + 1);
        }
      }
      paVar1 = &local_68.field_2;
      pcVar4 = (psVar6->_M_dataplus)._M_p;
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar4,pcVar4 + psVar6->_M_string_length);
      std::__cxx11::string::append((char *)&local_68);
      pFVar8 = NewPlaceholderFileWithMutexHeld(this,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,
                        CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                 local_68.field_2._M_local_buf[0]) + 1);
      }
      *(string **)(pFVar8 + 8) = local_40;
      if (placeholder_type == PLACEHOLDER_ENUM) {
        *(undefined4 *)(pFVar8 + 0x68) = 1;
        pTVar3 = (this->tables_).ptr_;
        if (pTVar3 != (Tables *)0x0) {
          __s.descriptor = (Descriptor *)Tables::AllocateBytes(pTVar3,0x38);
          ((anon_union_8_8_13f84498_for_Symbol_2 *)(pFVar8 + 0x70))->descriptor = (Descriptor *)__s;
          *(undefined8 *)__s.descriptor = 0;
          *(undefined8 *)(__s.descriptor + 8) = 0;
          *(undefined8 *)(__s.descriptor + 0x10) = 0;
          *(undefined8 *)(__s.descriptor + 0x18) = 0;
          *(undefined8 *)(__s.descriptor + 0x20) = 0;
          *(undefined8 *)(__s.descriptor + 0x28) = 0;
          *(undefined8 *)(__s.descriptor + 0x30) = 0;
          *(string **)(__s.descriptor + 8) = psVar6;
          *(string **)__s.descriptor = local_48;
          *(FileDescriptor **)(__s.descriptor + 0x10) = pFVar8;
          pEVar9 = EnumOptions::default_instance();
          *(EnumOptions **)(__s.descriptor + 0x20) = pEVar9;
          __s.descriptor[0x28] = (Descriptor)0x1;
          __s.descriptor[0x29] = (Descriptor)(*(name->_M_dataplus)._M_p != '.');
          *(undefined4 *)(__s.descriptor + 0x2c) = 1;
          pTVar3 = (this->tables_).ptr_;
          if (pTVar3 != (Tables *)0x0) {
            puVar10 = (undefined8 *)Tables::AllocateBytes(pTVar3,0x28);
            *(undefined8 **)(__s.descriptor + 0x30) = puVar10;
            *puVar10 = 0;
            puVar10[1] = 0;
            puVar10[2] = 0;
            puVar10[3] = 0;
            puVar10[4] = 0;
            pTVar3 = (this->tables_).ptr_;
            if (pTVar3 != (Tables *)0x0) {
              local_68._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_68,"PLACEHOLDER_VALUE","");
              psVar6 = Tables::AllocateString(pTVar3,&local_68);
              *puVar10 = psVar6;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != paVar1) {
                operator_delete(local_68._M_dataplus._M_p,
                                CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                         local_68.field_2._M_local_buf[0]) + 1);
              }
              sVar13 = local_40->_M_string_length;
              if (sVar13 == 0) {
                psVar6 = (string *)*puVar10;
              }
              else {
                pTVar3 = (this->tables_).ptr_;
                if (pTVar3 == (Tables *)0x0) goto LAB_00588c64;
                pcVar4 = (local_40->_M_dataplus)._M_p;
                local_68._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_68,pcVar4,pcVar4 + local_40->_M_string_length);
                std::__cxx11::string::append((char *)&local_68);
                psVar6 = Tables::AllocateString(pTVar3,&local_68);
              }
              puVar10[1] = psVar6;
              if ((sVar13 != 0) &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != paVar1)) {
                operator_delete(local_68._M_dataplus._M_p,
                                CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                         local_68.field_2._M_local_buf[0]) + 1);
              }
              *(undefined4 *)(puVar10 + 2) = 0;
              ((anon_union_8_8_13f84498_for_Symbol_2 *)(puVar10 + 3))->descriptor =
                   (Descriptor *)__s;
              pEVar12 = EnumValueOptions::default_instance();
              puVar10[4] = pEVar12;
              uVar15 = 4;
              goto LAB_0058882e;
            }
          }
        }
LAB_00588c64:
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                      ,0x5f,
                      "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
                     );
      }
      *(undefined4 *)(pFVar8 + 0x58) = 1;
      pTVar3 = (this->tables_).ptr_;
      if (pTVar3 == (Tables *)0x0) goto LAB_00588c64;
      __s.descriptor = (Descriptor *)Tables::AllocateBytes(pTVar3,0xa8);
      ((anon_union_8_8_13f84498_for_Symbol_2 *)(pFVar8 + 0x60))->descriptor = (Descriptor *)__s;
      memset(__s.descriptor,0,0xa8);
      *(string **)(__s.descriptor + 8) = psVar6;
      *(string **)__s.descriptor = local_48;
      *(FileDescriptor **)(__s.descriptor + 0x10) = pFVar8;
      pMVar11 = MessageOptions::default_instance();
      *(MessageOptions **)(__s.descriptor + 0x20) = pMVar11;
      __s.descriptor[0x28] = (Descriptor)0x1;
      __s.descriptor[0x29] = (Descriptor)(*(name->_M_dataplus)._M_p != '.');
      uVar15 = 1;
      if (placeholder_type == PLACEHOLDER_EXTENDABLE_MESSAGE) {
        *(undefined4 *)(__s.descriptor + 0x68) = 1;
        pTVar3 = (this->tables_).ptr_;
        if (pTVar3 == (Tables *)0x0) goto LAB_00588c64;
        puVar10 = (undefined8 *)Tables::AllocateBytes(pTVar3,8);
        *(undefined8 **)(__s.descriptor + 0x70) = puVar10;
        *puVar10 = 0x2000000000000001;
      }
      goto LAB_0058882e;
    }
  }
LAB_0058882b:
  uVar15 = 0;
  __s.descriptor = (Descriptor *)0x0;
LAB_0058882e:
  SVar16.field_1.descriptor = __s.descriptor;
  SVar16._0_8_ = uVar15;
  return SVar16;
}

Assistant:

Symbol DescriptorPool::NewPlaceholderWithMutexHeld(
    const string& name, PlaceholderType placeholder_type) const {
  if (mutex_) {
    mutex_->AssertHeld();
  }
  // Compute names.
  const string* placeholder_full_name;
  const string* placeholder_name;
  const string* placeholder_package;

  if (!ValidateQualifiedName(name)) return kNullSymbol;
  if (name[0] == '.') {
    // Fully-qualified.
    placeholder_full_name = tables_->AllocateString(name.substr(1));
  } else {
    placeholder_full_name = tables_->AllocateString(name);
  }

  string::size_type dotpos = placeholder_full_name->find_last_of('.');
  if (dotpos != string::npos) {
    placeholder_package = tables_->AllocateString(
      placeholder_full_name->substr(0, dotpos));
    placeholder_name = tables_->AllocateString(
      placeholder_full_name->substr(dotpos + 1));
  } else {
    placeholder_package = &internal::GetEmptyString();
    placeholder_name = placeholder_full_name;
  }

  // Create the placeholders.
  FileDescriptor* placeholder_file = NewPlaceholderFileWithMutexHeld(
      *placeholder_full_name + ".placeholder.proto");
  placeholder_file->package_ = placeholder_package;

  if (placeholder_type == PLACEHOLDER_ENUM) {
    placeholder_file->enum_type_count_ = 1;
    placeholder_file->enum_types_ =
      tables_->AllocateArray<EnumDescriptor>(1);

    EnumDescriptor* placeholder_enum = &placeholder_file->enum_types_[0];
    memset(placeholder_enum, 0, sizeof(*placeholder_enum));

    placeholder_enum->full_name_ = placeholder_full_name;
    placeholder_enum->name_ = placeholder_name;
    placeholder_enum->file_ = placeholder_file;
    placeholder_enum->options_ = &EnumOptions::default_instance();
    placeholder_enum->is_placeholder_ = true;
    placeholder_enum->is_unqualified_placeholder_ = (name[0] != '.');

    // Enums must have at least one value.
    placeholder_enum->value_count_ = 1;
    placeholder_enum->values_ = tables_->AllocateArray<EnumValueDescriptor>(1);

    EnumValueDescriptor* placeholder_value = &placeholder_enum->values_[0];
    memset(placeholder_value, 0, sizeof(*placeholder_value));

    placeholder_value->name_ = tables_->AllocateString("PLACEHOLDER_VALUE");
    // Note that enum value names are siblings of their type, not children.
    placeholder_value->full_name_ =
      placeholder_package->empty() ? placeholder_value->name_ :
        tables_->AllocateString(*placeholder_package + ".PLACEHOLDER_VALUE");

    placeholder_value->number_ = 0;
    placeholder_value->type_ = placeholder_enum;
    placeholder_value->options_ = &EnumValueOptions::default_instance();

    return Symbol(placeholder_enum);
  } else {
    placeholder_file->message_type_count_ = 1;
    placeholder_file->message_types_ =
      tables_->AllocateArray<Descriptor>(1);

    Descriptor* placeholder_message = &placeholder_file->message_types_[0];
    memset(placeholder_message, 0, sizeof(*placeholder_message));

    placeholder_message->full_name_ = placeholder_full_name;
    placeholder_message->name_ = placeholder_name;
    placeholder_message->file_ = placeholder_file;
    placeholder_message->options_ = &MessageOptions::default_instance();
    placeholder_message->is_placeholder_ = true;
    placeholder_message->is_unqualified_placeholder_ = (name[0] != '.');

    if (placeholder_type == PLACEHOLDER_EXTENDABLE_MESSAGE) {
      placeholder_message->extension_range_count_ = 1;
      placeholder_message->extension_ranges_ =
        tables_->AllocateArray<Descriptor::ExtensionRange>(1);
      placeholder_message->extension_ranges_->start = 1;
      // kMaxNumber + 1 because ExtensionRange::end is exclusive.
      placeholder_message->extension_ranges_->end =
        FieldDescriptor::kMaxNumber + 1;
    }

    return Symbol(placeholder_message);
  }
}